

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O3

void __thiscall
ddd::DictionaryMLT<false,_true>::enumerate
          (DictionaryMLT<false,_true> *this,vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pKVar3;
  KvPair *prefix_kv;
  pointer prefix;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> prefix_kvs;
  KvPair local_70;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> local_48;
  
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::clear(kvs);
  if (**(long **)(this + 8) != (*(long **)(this + 8))[1]) {
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::reserve(kvs,*(size_type *)(this + 0x30))
    ;
    local_48.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar1 = &local_70.key.field_2;
    local_70.key._M_string_length = 0;
    local_70.key.field_2._M_local_buf[0] = '\0';
    local_70.key._M_dataplus._M_p = (pointer)paVar1;
    DaTrie<false,_true,_true>::enumerate_prefix
              (*(DaTrie<false,_true,_true> **)(this + 8),0,&local_70.key,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.key._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.key._M_dataplus._M_p);
    }
    pKVar3 = local_48.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_48.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      prefix = local_48.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if ((long)(int)prefix->value < 0) {
          pcVar2 = (prefix->key)._M_dataplus._M_p;
          local_70.key._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,pcVar2 + (prefix->key)._M_string_length);
          local_70.value = prefix->value & 0x80000000;
          std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::emplace_back<ddd::KvPair>
                    (kvs,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.key._M_dataplus._M_p != paVar1) {
            operator_delete(local_70.key._M_dataplus._M_p);
          }
        }
        else {
          DaTrie<false,_true,_false>::enumerate
                    (*(DaTrie<false,_true,_false> **)
                      (*(long *)(this + 0x10) + (long)(int)prefix->value * 8),0,&prefix->key,kvs);
        }
        prefix = prefix + 1;
      } while (prefix != pKVar3);
    }
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::~vector(&local_48);
  }
  return;
}

Assistant:

void enumerate(std::vector<KvPair>& kvs) const {
    kvs.clear();
    if (prefix_subtrie_->is_empty()) {
      return;
    }
    kvs.reserve(num_keys_);

    std::vector<KvPair> prefix_kvs;
    prefix_subtrie_->enumerate_prefix(ROOT_POS, std::string{}, prefix_kvs);

    for (const auto& prefix_kv : prefix_kvs) {
      if ((prefix_kv.value >> 31) == 1) { // is terminal
        kvs.push_back(KvPair{prefix_kv.key, prefix_kv.value & (1U << 31)});
      } else {
        suffix_subtries_[prefix_kv.value]->enumerate(ROOT_POS, prefix_kv.key, kvs);
      }
    }
  }